

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O3

int run_test_fs_copyfile(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_fs_t *req_00;
  char **ppcVar5;
  char **path;
  uv_fs_t *req_01;
  char *unaff_R12;
  uv_fs_t *req_02;
  char *unaff_R15;
  code *name;
  char *req_03;
  int64_t eval_b;
  int64_t eval_a;
  char src [14];
  uv_fs_t req;
  uv_fs_t uStackY_600;
  uv_fs_t *puStackY_440;
  char *pcStackY_438;
  uv_fs_t *puStackY_430;
  uv_fs_t *puStackY_428;
  undefined1 auStack_418 [16];
  uv_buf_t uStack_408;
  uv_fs_t uStack_3f8;
  uv_loop_t *puStack_238;
  char *pcStack_230;
  char *local_200;
  char *local_1f8;
  undefined1 local_1f0 [104];
  char *local_188;
  char *local_138;
  
  uStack_408.len = (size_t)uStack_408.base;
  local_1f0._8_6_ = 0x6372735f65;
  local_1f0._0_6_ = 0x665f74736574;
  local_1f0._6_2_ = 0x6c69;
  loop = uv_default_loop();
  iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),local_1f0,"test_file_dst",-1
                         ,(uv_fs_cb)0x0);
  local_1f8 = (char *)(long)iVar3;
  local_200 = (char *)0xffffffffffffffea;
  if (local_1f8 == (char *)0xffffffffffffffea) {
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    unaff_R15 = local_1f0;
    unlink(unaff_R15);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),unaff_R15,"test_file_dst",
                           0,(uv_fs_cb)0x0);
    local_1f8 = local_188;
    local_200 = (char *)0xfffffffffffffffe;
    if (local_188 != (char *)0xfffffffffffffffe) goto LAB_001839d8;
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xfffffffffffffffe;
    if (local_1f8 != (char *)0xfffffffffffffffe) goto LAB_001839e7;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),"test_file_dst",(uv_fs_cb)0x0)
    ;
    if (iVar3 == 0) goto LAB_001839f6;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    unaff_R15 = local_1f0;
    touch_file(unaff_R15,0xc);
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),unaff_R15,unaff_R15,0,
                           (uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_001839fb;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),local_1f0,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183a0a;
    local_1f8 = (char *)0xc;
    local_200 = local_138;
    if (local_138 != (char *)0xc) goto LAB_00183a19;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    unlink(local_1f0);
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),
                           "test/fixtures/load_error.node","test_file_dst",0,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183a28;
    handle_result((uv_fs_t *)(local_1f0 + 0x10));
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    unaff_R12 = local_1f0;
    touch_file(unaff_R12,0);
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),unaff_R12,"test_file_dst",
                           0,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183a37;
    handle_result((uv_fs_t *)(local_1f0 + 0x10));
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),
                           "test/fixtures/load_error.node","test_file_dst",0,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183a46;
    handle_result((uv_fs_t *)(local_1f0 + 0x10));
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),"test_file_dst",0x1a4,
                        (uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183a55;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),
                           "test/fixtures/load_error.node","test_file_dst",1,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xffffffffffffffef;
    if (local_1f8 != (char *)0xffffffffffffffef) goto LAB_00183a64;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),"test_file_dst",0x1a4,
                        (uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    name = (code *)unaff_R15;
    if (local_1f8 != (char *)0x0) goto LAB_00183a73;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    name = (code *)local_1f0;
    touch_file((char *)name,1);
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),(char *)name,
                           "test_file_dst",0,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183a82;
    handle_result((uv_fs_t *)(local_1f0 + 0x10));
    unlink("test_file_dst");
    unaff_R12 = local_1f0;
    touch_file(unaff_R12,0x2000);
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),unaff_R12,"test_file_dst",
                           0,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    name = (code *)"test_file_dst";
    if (local_1f8 != (char *)0x0) goto LAB_00183a91;
    handle_result((uv_fs_t *)(local_1f0 + 0x10));
    name = handle_result;
    unlink(local_1f0);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(loop,(uv_fs_t *)(local_1f0 + 0x10),"test/fixtures/load_error.node",
                           "test_file_dst",0,handle_result);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183aa0;
    local_1f8 = (char *)0x5;
    local_200 = (char *)(long)result_check_count;
    if (local_200 != (char *)0x5) goto LAB_00183aaf;
    uv_run(loop,UV_RUN_DEFAULT);
    local_1f8 = (char *)0x6;
    local_200 = (char *)(long)result_check_count;
    if (local_200 != (char *)0x6) goto LAB_00183abe;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),"test_file_dst",0x1a4,
                        (uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    req_03 = (char *)name;
    if (local_1f8 != (char *)0x0) goto LAB_00183acd;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    req_03 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(loop,(uv_fs_t *)(local_1f0 + 0x10),"test/fixtures/load_error.node",
                           "test_file_dst",-1,fail_cb);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xffffffffffffffea;
    if (local_1f8 != (char *)0xffffffffffffffea) goto LAB_00183adc;
    uv_run(loop,UV_RUN_DEFAULT);
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),
                           "test/fixtures/load_error.node","test_file_dst",2,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (local_1f8 != (char *)0x0) goto LAB_00183aeb;
    handle_result((uv_fs_t *)(local_1f0 + 0x10));
    req_03 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)(local_1f0 + 0x10),
                           "test/fixtures/load_error.node","test_file_dst",4,(uv_fs_cb)0x0);
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0x0;
    if (0 < (long)local_1f8) goto LAB_00183afa;
    if (iVar3 == 0) {
      handle_result((uv_fs_t *)(local_1f0 + 0x10));
    }
    unlink("test_file_dst");
    touch_file("test_file_dst",0);
    chmod("test_file_dst",0x124);
    req_03 = local_1f0 + 0x10;
    iVar3 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)req_03,"test/fixtures/load_error.node",
                           "test_file_dst",0,(uv_fs_cb)0x0);
    local_1f8 = local_188;
    local_200 = (char *)0xfffffffffffffff3;
    if (local_188 != (char *)0xfffffffffffffff3) goto LAB_00183b09;
    local_1f8 = (char *)(long)iVar3;
    local_200 = (char *)0xfffffffffffffff3;
    if (local_1f8 != (char *)0xfffffffffffffff3) goto LAB_00183b18;
    uv_fs_req_cleanup((uv_fs_t *)(local_1f0 + 0x10));
    unlink("test_file_dst");
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(loop,UV_RUN_DEFAULT);
    local_1f8 = (char *)0x0;
    iVar3 = uv_loop_close(loop);
    local_200 = (char *)(long)iVar3;
    if (local_1f8 == local_200) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_copyfile_cold_1();
LAB_001839d8:
    run_test_fs_copyfile_cold_2();
LAB_001839e7:
    run_test_fs_copyfile_cold_3();
LAB_001839f6:
    run_test_fs_copyfile_cold_25();
LAB_001839fb:
    run_test_fs_copyfile_cold_4();
LAB_00183a0a:
    run_test_fs_copyfile_cold_5();
LAB_00183a19:
    run_test_fs_copyfile_cold_6();
LAB_00183a28:
    run_test_fs_copyfile_cold_7();
LAB_00183a37:
    run_test_fs_copyfile_cold_8();
LAB_00183a46:
    run_test_fs_copyfile_cold_9();
LAB_00183a55:
    run_test_fs_copyfile_cold_10();
LAB_00183a64:
    run_test_fs_copyfile_cold_11();
    name = (code *)unaff_R15;
LAB_00183a73:
    run_test_fs_copyfile_cold_12();
LAB_00183a82:
    run_test_fs_copyfile_cold_13();
LAB_00183a91:
    run_test_fs_copyfile_cold_14();
LAB_00183aa0:
    run_test_fs_copyfile_cold_15();
LAB_00183aaf:
    run_test_fs_copyfile_cold_16();
LAB_00183abe:
    run_test_fs_copyfile_cold_17();
    req_03 = (char *)name;
LAB_00183acd:
    run_test_fs_copyfile_cold_18();
LAB_00183adc:
    run_test_fs_copyfile_cold_19();
LAB_00183aeb:
    run_test_fs_copyfile_cold_20();
LAB_00183afa:
    run_test_fs_copyfile_cold_24();
LAB_00183b09:
    run_test_fs_copyfile_cold_21();
LAB_00183b18:
    run_test_fs_copyfile_cold_22();
  }
  path = &local_1f8;
  ppcVar5 = &local_200;
  run_test_fs_copyfile_cold_23();
  req_00 = &uStack_3f8;
  puStackY_428 = (uv_fs_t *)0x183b69;
  puStack_238 = loop;
  pcStack_230 = unaff_R12;
  uVar4 = uv_fs_open((uv_loop_t *)0x0,req_00,(char *)path,0x241,0x180,(uv_fs_cb)0x0);
  req_02 = (uv_fs_t *)(ulong)uVar4;
  puStackY_428 = (uv_fs_t *)0x183b74;
  uv_fs_req_cleanup(req_00);
  uStack_408.base = (char *)(long)(int)uVar4;
  auStack_418._0_8_ = (void *)0x0;
  if ((char *)(long)(int)uVar4 == (char *)0x0) {
    req_00 = (uv_fs_t *)(ulong)(uint)uStack_3f8.result;
    puStackY_428 = (uv_fs_t *)0x183bad;
    uStack_408 = uv_buf_init("a",1);
    if ((int)ppcVar5 != 0) {
      req_03 = (char *)0x0;
      req_02 = &uStack_3f8;
      unaff_R12 = (char *)0x0;
      do {
        puStackY_428 = (uv_fs_t *)0x183be7;
        iVar3 = uv_fs_write((uv_loop_t *)0x0,req_02,(uint)uStack_3f8.result,&uStack_408,1,
                            (int64_t)unaff_R12,(uv_fs_cb)0x0);
        puStackY_428 = (uv_fs_t *)0x183bf1;
        uv_fs_req_cleanup(req_02);
        auStack_418._0_8_ = SEXT48(iVar3);
        auStack_418._8_8_ = (uv_loop_t *)0x0;
        if ((long)auStack_418._0_8_ < 0) {
          puStackY_428 = (uv_fs_t *)0x183c6d;
          touch_file_cold_2();
          goto LAB_00183c6d;
        }
        unaff_R12 = unaff_R12 + 1;
      } while ((char *)((ulong)ppcVar5 & 0xffffffff) != unaff_R12);
    }
    req_02 = &uStack_3f8;
    puStackY_428 = (uv_fs_t *)0x183c25;
    uVar4 = uv_fs_close((uv_loop_t *)0x0,req_02,(uint)uStack_3f8.result,(uv_fs_cb)0x0);
    req_00 = (uv_fs_t *)(ulong)uVar4;
    puStackY_428 = (uv_fs_t *)0x183c2f;
    uv_fs_req_cleanup(req_02);
    auStack_418._0_8_ = SEXT48((int)uVar4);
    auStack_418._8_8_ = (uv_loop_t *)0x0;
    if ((void *)auStack_418._0_8_ == (void *)0x0) {
      return uVar4;
    }
  }
  else {
LAB_00183c6d:
    puStackY_428 = (uv_fs_t *)0x183c7c;
    touch_file_cold_1();
  }
  req_01 = (uv_fs_t *)auStack_418;
  puStackY_428 = (uv_fs_t *)handle_result;
  touch_file_cold_3();
  uStackY_600.data = (void *)(long)req_01->fs_type;
  puStackY_440 = req_00;
  pcStackY_438 = unaff_R12;
  puStackY_430 = req_02;
  puStackY_428 = (uv_fs_t *)req_03;
  if (uStackY_600.data == (void *)0x1e) {
    uStackY_600.data = (void *)req_01->result;
    if (uStackY_600.data != (void *)0x0) goto LAB_00183dd3;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&uStackY_600,req_01->path,(uv_fs_cb)0x0);
    uVar2 = uStackY_600.statbuf.st_size;
    uVar1 = uStackY_600.statbuf.st_mode;
    if (iVar3 != 0) goto LAB_00183de2;
    uv_fs_req_cleanup(&uStackY_600);
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&uStackY_600,"test_file_dst",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00183df1;
    if (uStackY_600.statbuf.st_size == uVar2) {
      if (uStackY_600.statbuf.st_mode == uVar1) {
        uv_fs_req_cleanup(&uStackY_600);
        uv_fs_req_cleanup(req_01);
        result_check_count = result_check_count + 1;
        return extraout_EAX;
      }
      goto LAB_00183e0f;
    }
  }
  else {
    handle_result_cold_1();
LAB_00183dd3:
    handle_result_cold_2();
LAB_00183de2:
    handle_result_cold_3();
LAB_00183df1:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_00183e0f:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
          ,0x2c,"fail_cb should not have been called");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_EQ(req.result, UV_ENOENT);
  ASSERT_EQ(r, UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
  /* Verify that the src file did not get truncated. */
  r = uv_fs_stat(NULL, &req, src, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(12, req.statbuf.st_size);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT_EQ(r, UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT_OK(r);
  ASSERT_EQ(5, result_check_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(6, result_check_count);
  /* Ensure file is user-writable (not copied from src). */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT_EQ(r, UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT_LE(r, 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT_EQ(req.result, UV_EACCES);
  ASSERT_EQ(r, UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}